

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTransactionController *this,ElementsConfidentialAddress *address,
          Amount *value,ConfidentialAssetId *asset,bool remove_nonce)

{
  Script *in_RCX;
  ElementsConfidentialAddress *in_RDX;
  ConfidentialAssetId *in_RSI;
  ConfidentialTxOutReference *in_RDI;
  byte in_R9B;
  ElementsConfidentialAddress confidential_addr;
  ByteData nonce;
  Script locking_script;
  ByteData hash_data;
  ElementsConfidentialAddress *in_stack_fffffffffffffd00;
  Amount *in_stack_fffffffffffffd28;
  Script *in_stack_fffffffffffffd30;
  ConfidentialTransactionController *in_stack_fffffffffffffd38;
  ConfidentialKey local_2b0;
  ByteData local_298;
  string local_280;
  ElementsConfidentialAddress local_260;
  ByteData local_a8;
  Script local_80;
  ByteData local_48;
  byte local_29;
  Script *local_20;
  ElementsConfidentialAddress *local_18;
  
  local_29 = in_R9B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  core::ElementsConfidentialAddress::GetHash(&local_48,in_RDX);
  core::ElementsConfidentialAddress::GetLockingScript(&local_80,local_18);
  core::ByteData::ByteData(&local_a8);
  if ((local_29 & 1) == 0) {
    core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_280,local_18);
    core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    core::ElementsConfidentialAddress::GetConfidentialKey(&local_2b0,&local_260);
    core::Pubkey::GetData(&local_298,&local_2b0);
    core::ByteData::operator=(&local_a8,&local_298);
    core::ByteData::~ByteData((ByteData *)0x58447c);
    core::Pubkey::~Pubkey((Pubkey *)0x584486);
    core::ElementsConfidentialAddress::~ElementsConfidentialAddress(in_stack_fffffffffffffd00);
  }
  core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)&stack0xfffffffffffffd28,&local_a8);
  AddTxOut(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_RSI,
           (ConfidentialNonce *)in_RDI);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5845cf);
  core::ByteData::~ByteData((ByteData *)0x5845dc);
  core::Script::~Script(local_20);
  core::ByteData::~ByteData((ByteData *)0x5845f6);
  return in_RDI;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  ByteData nonce;
  if (!remove_nonce) {
    ElementsConfidentialAddress confidential_addr(address.GetAddress());
    nonce = confidential_addr.GetConfidentialKey().GetData();
  }
  return AddTxOut(locking_script, value, asset, ConfidentialNonce(nonce));
}